

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O3

int lj_sysprof_set_backtracer(luam_Sysprof_backtracer backtracer)

{
  int iVar1;
  bool bVar2;
  void *dummy;
  undefined8 local_8;
  
  iVar1 = 1;
  if (sysprof.state == 0) {
    if (backtracer == (luam_Sysprof_backtracer)0x0) {
      sysprof.backtracer = default_backtrace_host;
      local_8 = 0;
      backtrace(&local_8,1);
      bVar2 = sysprof.backtracer != (luam_Sysprof_backtracer)0x0;
    }
    else {
      bVar2 = true;
      sysprof.backtracer = backtracer;
    }
    iVar1 = 0;
    if (((bVar2) && (sysprof.on_stop != (luam_Sysprof_on_stop)0x0)) &&
       (sysprof.writer != (luam_Sysprof_writer)0x0)) {
      sysprof.state = 0;
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int lj_sysprof_set_backtracer(luam_Sysprof_backtracer backtracer) {
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_IDLE)
    return PROFILE_ERRUSE;
  if (backtracer == NULL) {
    sp->backtracer = default_backtrace_host;
    /*
    ** XXX: `backtrace` is not signal-safe, according to man,
    ** because it is lazy loaded on the first call, which triggers
    ** allocations. We need to call `backtrace` before starting profiling
    ** to avoid lazy loading.
    */
    void *dummy = NULL;
    backtrace(&dummy, 1);
  }
  else {
    sp->backtracer = backtracer;
  }
  if (!is_unconfigured(sp)) {
    sp->state = SPS_IDLE;
  }
  return PROFILE_SUCCESS;
}